

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,AccessChainFlags flags,AccessChainMeta *meta)

{
  Variant *pVVar1;
  pointer pcVar2;
  ID id;
  char cVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  uint32_t uVar7;
  int iVar8;
  BuiltIn BVar9;
  ExecutionModel EVar10;
  SPIRExpression *pSVar11;
  SPIRType *pSVar12;
  long lVar13;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  string *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined7 extraout_var_01;
  undefined8 uVar16;
  SPIRVariable *pSVar17;
  SPIRType *pSVar18;
  SPIRConstant *pSVar19;
  mapped_type *pmVar20;
  size_t sVar21;
  runtime_error *prVar22;
  uint uVar23;
  undefined7 uVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint uVar25;
  uint id_00;
  ulong uVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  CompilerGLSL *pCVar28;
  _Alloc_hider _Var29;
  AccessChainFlags AVar30;
  undefined4 in_register_00000084;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar31;
  undefined4 in_register_0000008c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3;
  bool bVar32;
  ulong uVar33;
  ulong uVar34;
  bool is_packed;
  bool access_chain_is_arrayed;
  string qual_mbr_name;
  BuiltIn builtin;
  bool local_f2;
  undefined1 local_f1 [9];
  string local_e8;
  AccessChainFlags local_c4;
  StorageClass local_c0;
  ID local_bc;
  uint local_b8;
  uint local_b4;
  string local_b0;
  uint local_90;
  BuiltIn local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  BuiltIn local_7c;
  ulong local_78;
  uint local_70;
  uint local_6c;
  string local_68;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_48;
  ulong local_40;
  uint32_t *local_38;
  
  ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_0000008c,flags);
  pbVar31 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(in_register_00000084,count);
  local_f1._1_8_ = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_f1._1_8_;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = (ulong)base;
  local_c4 = flags;
  local_bc.id = base;
  local_38 = indices;
  if ((flags & 2) == 0) {
    bVar4 = true;
    if ((local_78 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size
        ) && (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar1[local_78].type == TypeExpression)) {
      pSVar11 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + local_78);
      bVar32 = pSVar11->need_transpose;
      pSVar11->need_transpose = false;
      bVar4 = false;
    }
    else {
      bVar32 = false;
      pSVar11 = (SPIRExpression *)0x0;
    }
    to_enclosed_expression_abi_cxx11_((string *)(local_f1 + 9),this,local_bc.id,(flags & 8) == 0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_f1 + 9));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (!bVar4) {
      pSVar11->need_transpose = bVar32;
    }
  }
  AVar30 = local_c4;
  uVar7 = Compiler::expression_type_id(&this->super_Compiler,local_bc.id);
  uVar33 = (ulong)uVar7;
  if ((this->backend).native_pointers == false) {
    if ((AVar30 & 4) != 0) {
      prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_f1 + 9),
                 "Backend does not support native pointers and does not support OpPtrAccessChain.",
                 "");
      ::std::runtime_error::runtime_error(prVar22,(string *)(local_f1 + 9));
      *(undefined ***)prVar22 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar22,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar4 = should_dereference(this,local_bc.id);
    if (bVar4) {
      pSVar12 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + uVar33);
      dereference_expression((string *)(local_f1 + 9),this,pSVar12,__return_storage_ptr__);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_f1 + 9));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
  }
  pSVar12 = Compiler::get_pointee_type(&this->super_Compiler,uVar7);
  lVar13 = ::std::__cxx11::string::find((char)__return_storage_ptr__,0x5b);
  id.id = local_bc.id;
  local_f1[0] = lVar13 != -1;
  local_b4 = (*(this->super_Compiler)._vptr_Compiler[0x27])(this,(ulong)local_bc.id);
  local_f2 = Compiler::has_extended_decoration
                       (&this->super_Compiler,id.id,SPIRVCrossDecorationPhysicalTypePacked);
  local_c0 = Compiler::get_extended_decoration
                       (&this->super_Compiler,id.id,SPIRVCrossDecorationPhysicalTypeID);
  bVar4 = Compiler::has_decoration(&this->super_Compiler,id,DecorationInvariant);
  local_84 = (uint)CONCAT71(extraout_var,bVar4);
  bVar4 = Compiler::has_decoration(&this->super_Compiler,id,DecorationRelaxedPrecision);
  local_88 = (uint)CONCAT71(extraout_var_00,bVar4);
  if (count != 0) {
    local_6c = AVar30 & 0x11;
    local_48 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&(this->super_Compiler).ir.meta;
    local_80 = AVar30 & 0xfffffffa;
    local_70 = AVar30 & 0xfffffffe;
    uVar34 = 0;
    local_b8 = 0;
    local_90 = 0;
    local_40 = (ulong)count;
    do {
      uVar23 = local_38[uVar34];
      uVar7 = local_c4 & 0xff;
      uVar25 = 0;
      if (-1 < (int)uVar23) {
        uVar25 = uVar7;
      }
      id_00 = uVar23 & 0x7fffffff;
      if (local_6c != 0x11) {
        id_00 = uVar23;
      }
      uVar26 = (ulong)id_00;
      if (local_6c != 0x11) {
        uVar25 = uVar7;
      }
      bVar4 = uVar34 != 0 || (local_c4 & 4) == 0;
      pSVar18 = (SPIRType *)(ulong)CONCAT31((int3)(uVar23 >> 8),bVar4);
      if (bVar4) {
        sVar21 = (pSVar12->array).super_VectorView<unsigned_int>.buffer_size;
        if (sVar21 != 0) {
          if (((this->options).flatten_multidimensional_arrays == true) && ((local_b8 & 1) == 0)) {
            if (sVar21 == 1) {
              local_90 = 0;
              local_b8 = 0;
            }
            else {
              local_90 = (uint)CONCAT71((int7)(sVar21 >> 8),1);
              uVar16 = ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              local_b8 = (uint)CONCAT71((int7)((ulong)uVar16 >> 8),1);
            }
          }
          if ((pSVar12->parent_type).id == 0) {
            __assert_fail("type->parent_type",
                          "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                          ,0x23c9,
                          "string spirv_cross::CompilerGLSL::access_chain_internal(uint32_t, const uint32_t *, uint32_t, AccessChainFlags, AccessChainMeta *)"
                         );
          }
          if (local_78 <
              (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) {
            pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
            pSVar18 = (SPIRType *)(local_78 * 3);
            if ((((pVVar1[local_78].type != TypeVariable) ||
                 (pSVar17 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + local_78), uVar34 != 0)
                 ) || ((this->backend).force_gl_in_out_block == false)) ||
               ((bVar4 = Compiler::is_builtin_variable(&this->super_Compiler,pSVar17), !bVar4 ||
                (bVar4 = Compiler::has_decoration
                                   (&this->super_Compiler,(ID)(pSVar12->super_IVariant).self.id,
                                    DecorationBlock), bVar4)))) goto LAB_001e8e25;
            local_e8._M_dataplus._M_p._0_4_ = local_bc.id;
            pmVar20 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_48,(key_type *)(local_f1 + 9));
            local_8c = (pmVar20->decoration).builtin_type;
            EVar10 = Compiler::get_execution_model(&this->super_Compiler);
            pbVar31 = __return_storage_ptr__;
            if (local_8c < BuiltInTessLevelOuter) {
              pSVar18 = (SPIRType *)0x680;
              if ((0x680U >> (local_8c & BuiltInGlobalSize) & 1) != 0) goto LAB_001e9693;
              pSVar18 = (SPIRType *)0x3;
              if ((3U >> (local_8c & BuiltInGlobalSize) & 1) == 0) goto LAB_001e967f;
              if (EVar10 == ExecutionModelMeshEXT) {
                to_expression_abi_cxx11_(&local_b0,this,id_00,(local_c4 & 8) == 0);
                join<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          ((string *)(local_f1 + 9),(spirv_cross *)"gl_MeshVerticesEXT[",
                           (char (*) [20])&local_b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x345734,(char (*) [3])__return_storage_ptr__,ts_3);
              }
              else if (pSVar17->storage == StorageClassOutput) {
                to_expression_abi_cxx11_(&local_b0,this,id_00,(local_c4 & 8) == 0);
                join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          ((string *)(local_f1 + 9),(spirv_cross *)"gl_out[",(char (*) [8])&local_b0
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x345734,(char (*) [3])__return_storage_ptr__,ts_3);
              }
              else {
                if (pSVar17->storage != StorageClassInput) goto LAB_001e998a;
                to_expression_abi_cxx11_(&local_b0,this,id_00,(local_c4 & 8) == 0);
                join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          ((string *)(local_f1 + 9),(spirv_cross *)"gl_in[",(char (*) [7])&local_b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x345734,(char (*) [3])__return_storage_ptr__,ts_3);
              }
LAB_001e96e0:
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)(local_f1 + 9));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
            }
            else {
LAB_001e967f:
              if ((local_8c == BuiltInPrimitiveShadingRateKHR) ||
                 (local_8c == BuiltInCullPrimitiveEXT)) {
LAB_001e9693:
                if (EVar10 == ExecutionModelMeshEXT) {
                  to_expression_abi_cxx11_(&local_b0,this,id_00,(local_c4 & 8) == 0);
                  join<char_const(&)[22],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                            ((string *)(local_f1 + 9),(spirv_cross *)"gl_MeshPrimitivesEXT[",
                             (char (*) [22])&local_b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x345734,(char (*) [3])__return_storage_ptr__,ts_3);
                  goto LAB_001e96e0;
                }
              }
LAB_001e998a:
              AVar30 = local_80;
              if ((uVar25 & 1) != 0) {
                AVar30 = local_c4;
              }
              pbVar31 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (ulong)(AVar30 & 0xfffffffb);
              ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
              access_chain_internal_append_index
                        (this,__return_storage_ptr__,local_8c,pSVar18,AVar30 & 0xfffffffb,
                         (bool *)ts_3,id_00);
              (*(this->super_Compiler)._vptr_Compiler[0x2c])
                        (this,__return_storage_ptr__,pSVar12,(ulong)local_c0);
            }
          }
          else {
LAB_001e8e25:
            if (((this->options).flatten_multidimensional_arrays == true) && ((local_90 & 1) != 0))
            {
              pSVar18 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (pSVar12->parent_type).id);
              if ((uVar25 & 1) == 0) {
                to_enclosed_expression_abi_cxx11_
                          ((string *)(local_f1 + 9),this,id_00,(local_c4 & 8) == 0);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              }
              else {
                cVar6 = '\x01';
                if (9 < id_00) {
                  cVar3 = '\x04';
                  do {
                    cVar6 = cVar3;
                    uVar23 = (uint)uVar26;
                    if (uVar23 < 100) {
                      cVar6 = cVar6 + -2;
                      goto LAB_001e9536;
                    }
                    if (uVar23 < 1000) {
                      cVar6 = cVar6 + -1;
                      goto LAB_001e9536;
                    }
                    if (uVar23 < 10000) goto LAB_001e9536;
                    uVar26 = uVar26 / 10000;
                    cVar3 = cVar6 + '\x04';
                  } while (99999 < uVar23);
                  cVar6 = cVar6 + '\x01';
                }
LAB_001e9536:
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                ::std::__cxx11::string::_M_construct((ulong)(local_f1 + 9),cVar6);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_e8._M_dataplus._M_p,(undefined4)local_e8._M_string_length,id_00);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              sVar21 = (pSVar18->array).super_VectorView<unsigned_int>.buffer_size;
              uVar7 = (uint32_t)sVar21;
              if (uVar7 != 0) {
                do {
                  uVar7 = uVar7 - 1;
                  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                  pCVar28 = this;
                  to_array_size_abi_cxx11_(&local_b0,this,pSVar18,uVar7);
                  enclose_expression((string *)(local_f1 + 9),pCVar28,&local_b0);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p);
                  }
                } while (uVar7 != 0);
                sVar21 = (pSVar18->array).super_VectorView<unsigned_int>.buffer_size;
              }
              if (sVar21 == 0) {
                local_b8 = 0;
              }
              else {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                if ((local_b8 & 1) != 0) goto LAB_001e9641;
              }
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            else {
              uVar7 = Compiler::get_decoration(&this->super_Compiler,local_bc,DecorationBuiltIn);
              pSVar18 = (SPIRType *)(this->super_Compiler)._vptr_Compiler;
              cVar6 = (*(code *)(pSVar18->member_name_cache)._M_h._M_bucket_count)(this,uVar7);
              if (cVar6 == '\0') {
                AVar30 = local_80;
                if ((uVar25 & 1) != 0) {
                  AVar30 = local_c4;
                }
                pbVar31 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (ulong)(AVar30 & 0xfffffffb);
                ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1
                ;
                access_chain_internal_append_index
                          (this,__return_storage_ptr__,extraout_EDX_00,pSVar18,AVar30 & 0xfffffffb,
                           (bool *)ts_3,id_00);
                (*(this->super_Compiler)._vptr_Compiler[0x2c])
                          (this,__return_storage_ptr__,pSVar12,(ulong)local_c0);
              }
            }
          }
LAB_001e9641:
          uVar33 = (ulong)(pSVar12->parent_type).id;
          pSVar12 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                               ptr + uVar33);
          goto LAB_001e9664;
        }
        if (*(int *)&(pSVar12->super_IVariant).field_0xc == 0xf) {
          if ((uVar25 & 1) == 0) {
            uVar7 = Compiler::evaluate_constant_u32(&this->super_Compiler,id_00);
            uVar26 = (ulong)uVar7;
          }
          uVar23 = (uint)uVar26;
          if (uVar23 < (uint)(pSVar12->member_type_index_redirection).super_VectorView<unsigned_int>
                             .buffer_size) {
            uVar23 = (pSVar12->member_type_index_redirection).super_VectorView<unsigned_int>.ptr
                     [uVar26];
          }
          pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)uVar23;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pSVar12->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size <= pbVar27) {
            prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_f1 + 9),"Member index is out of bounds!","");
            ::std::runtime_error::runtime_error(prVar22,(string *)(local_f1 + 9));
            *(undefined ***)prVar22 = &PTR__runtime_error_003d4e98;
            __cxa_throw(prVar22,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar4 = Compiler::is_member_builtin(&this->super_Compiler,pSVar12,uVar23,&local_7c);
          if ((bVar4) &&
             (iVar8 = (*(this->super_Compiler)._vptr_Compiler[0x2b])(this,(ulong)local_bc.id),
             (char)iVar8 != '\0')) {
            if (local_f1[0] == '\x01') {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              (*(this->super_Compiler)._vptr_Compiler[0x14])
                        (local_f1 + 9,this,(ulong)local_7c,(ulong)pSVar12->storage);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
            }
            else {
              (*(this->super_Compiler)._vptr_Compiler[0x14])
                        ((string *)(local_f1 + 9),this,(ulong)local_7c,(ulong)pSVar12->storage);
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)(local_f1 + 9));
            }
          }
          else {
            psVar14 = Compiler::get_member_qualified_name_abi_cxx11_
                                (&this->super_Compiler,(TypeID)(uint32_t)uVar33,uVar23);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            pcVar2 = (psVar14->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_f1 + 9),pcVar2,pcVar2 + psVar14->_M_string_length);
            if (local_e8._M_string_length == 0) {
              ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (ulong)local_c4;
              if ((local_c4 & 0x20) == 0) {
                ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (ulong)((local_c4 & 4) >> 2);
                pbVar31 = pbVar27;
                (*(this->super_Compiler)._vptr_Compiler[0x2e])
                          (&local_b0,this,(ulong)local_bc.id,pSVar12);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
                psVar14 = &local_b0;
                _Var29._M_p = local_b0._M_dataplus._M_p;
              }
              else {
                ts_1 = pbVar27;
                to_member_name_abi_cxx11_(&local_68,this,pSVar12,uVar23);
                join<char_const(&)[2],std::__cxx11::string>
                          (&local_b0,(spirv_cross *)0x349680,(char (*) [2])&local_68,ts_1);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p);
                }
                psVar14 = &local_68;
                _Var29._M_p = local_68._M_dataplus._M_p;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var29._M_p != &psVar14->field_2) {
                operator_delete(_Var29._M_p);
              }
            }
            else {
              ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          bVar4 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)(pSVar12->super_IVariant).self.id,uVar23,
                             DecorationInvariant);
          local_84 = local_84 & 0xff;
          if (bVar4) {
            local_84 = 1;
          }
          bVar4 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)(pSVar12->super_IVariant).self.id,uVar23,
                             DecorationRelaxedPrecision);
          local_88 = local_88 & 0xff;
          if (bVar4) {
            local_88 = 1;
          }
          local_f2 = Compiler::has_extended_member_decoration
                               (&this->super_Compiler,(pSVar12->super_IVariant).self.id,uVar23,
                                SPIRVCrossDecorationPhysicalTypePacked);
          bVar4 = Compiler::has_extended_member_decoration
                            (&this->super_Compiler,(pSVar12->super_IVariant).self.id,uVar23,
                             SPIRVCrossDecorationPhysicalTypeID);
          local_c0 = 0;
          if (bVar4) {
            local_c0 = Compiler::get_extended_member_decoration
                                 (&this->super_Compiler,(pSVar12->super_IVariant).self.id,uVar23,
                                  SPIRVCrossDecorationPhysicalTypeID);
          }
          local_b4 = (*(this->super_Compiler)._vptr_Compiler[0x28])(this,pSVar12,pbVar27);
          pSVar12 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                               ptr + (pSVar12->member_types).
                                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                     ptr[(long)pbVar27].id);
        }
        else if (pSVar12->columns < 2) {
          if (pSVar12->vecsize < 2) {
            if ((this->backend).allow_truncated_access_chain == false) {
              prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(local_f1 + 9),"Cannot subdivide a scalar value!","");
              ::std::runtime_error::runtime_error(prVar22,(string *)(local_f1 + 9));
              *(undefined ***)prVar22 = &PTR__runtime_error_003d4e98;
              __cxa_throw(prVar22,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          else {
            paVar15 = &local_e8.field_2;
            local_e8._M_string_length = 0;
            local_e8.field_2._M_local_buf[0] = '\0';
            local_e8._M_dataplus._M_p = (pointer)paVar15;
            if (((local_b4 & 1) != 0) &&
               (paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)::std::__cxx11::string::rfind((char)__return_storage_ptr__,0x5b),
               paVar15 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xffffffffffffffff)) {
              ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)__return_storage_ptr__);
              ::std::__cxx11::string::operator=((string *)(local_f1 + 9),(string *)&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)::std::__cxx11::string::resize
                                     ((ulong)__return_storage_ptr__,(char)paVar15);
            }
            if ((local_c4 & 0x40) == 0) {
              pSVar18 = Compiler::expression_type(&this->super_Compiler,local_bc.id);
              local_c0 = StorageClassGeneric;
              if (pSVar18->pointer == true) {
                local_c0 = get_expression_effective_storage_class(this,local_bc.id);
              }
              pSVar17 = Compiler::maybe_get_backing_variable(&this->super_Compiler,local_bc.id);
              if (((pSVar17 == (SPIRVariable *)0x0) || (pSVar17->storage != StorageClassOutput)) ||
                 (EVar10 = Compiler::get_execution_model(&this->super_Compiler),
                 EVar10 != ExecutionModelTessellationControl)) {
                BVar9 = BuiltInPosition;
              }
              else {
                bVar4 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(pSVar17->super_IVariant).self.id,
                                   DecorationPatch);
                BVar9 = (BuiltIn)CONCAT71(extraout_var_01,bVar4) ^ BuiltInPointSize;
              }
              if (((char)BVar9 == '\0') && ((local_b4 & 1) == 0)) {
                pSVar18 = Variant::get<spirv_cross::SPIRType>
                                    ((this->super_Compiler).ir.ids.
                                     super_VectorView<spirv_cross::Variant>.ptr +
                                     (pSVar12->parent_type).id);
                ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (this->super_Compiler)._vptr_Compiler;
                pbVar31 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_f2;
                (*(code *)ts_3[0xb]._M_string_length)(this,__return_storage_ptr__,pSVar18,local_c0);
                BVar9 = BuiltInPosition;
              }
            }
            else {
              local_c0 = StorageClassGeneric;
              BVar9 = (BuiltIn)CONCAT71((int7)((ulong)paVar15 >> 8),1);
            }
            local_8c = BVar9;
            if ((uVar25 & 1) == 0) {
              pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
              if ((pVVar1[uVar26].type == TypeConstant) && (((local_f2 | (byte)local_b4) & 1) == 0))
              {
                pSVar19 = Variant::get<spirv_cross::SPIRConstant>(pVVar1 + uVar26);
                if (pSVar19->specialization == true) {
                  if ((pSVar19->m).c[0].r[0].u32 < pSVar12->vecsize) {
                    to_expression_abi_cxx11_(&local_68,this,id_00,true);
                  }
                  else {
                    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"0","");
                  }
                  join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                            (&local_b0,(spirv_cross *)0x3434bc,(char (*) [2])&local_68,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x33ba6c,(char (*) [2])pbVar31);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p);
                  }
                  psVar14 = &local_68;
                  _Var29._M_p = local_68._M_dataplus._M_p;
                  goto LAB_001e9879;
                }
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              else {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                to_unpacked_expression_abi_cxx11_(&local_b0,this,id_00,(local_c4 & 8) == 0);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p);
                }
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
            }
            else if (((local_f2 | (byte)local_b4) & 1) == 0) {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            else {
              if (pSVar12->vecsize <= id_00) {
                id_00 = 0;
              }
              local_68._M_dataplus._M_p._0_4_ = id_00;
              join<char_const(&)[2],unsigned_int,char_const(&)[2]>
                        (&local_b0,(spirv_cross *)0x3434bc,(char (*) [2])&local_68,(uint *)0x33ba6c,
                         (char (*) [2])pbVar31);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
              psVar14 = &local_b0;
              _Var29._M_p = local_b0._M_dataplus._M_p;
LAB_001e9879:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var29._M_p != &psVar14->field_2) {
                operator_delete(_Var29._M_p);
              }
            }
            if ((((byte)local_8c | ~(byte)local_b4) & 1) == 0) {
              pSVar18 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (pSVar12->parent_type).id);
              ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (this->super_Compiler)._vptr_Compiler;
              pbVar31 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_f2;
              (*(code *)ts_3[0xb]._M_string_length)(this,__return_storage_ptr__,pSVar18,local_c0);
            }
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
            local_f2 = false;
            uVar33 = (ulong)(pSVar12->parent_type).id;
            pSVar12 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_Compiler).ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar33);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            local_c0 = 0;
            local_b4 = 0;
          }
        }
        else {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          if ((uVar25 & 1) == 0) {
            to_unpacked_expression_abi_cxx11_
                      ((string *)(local_f1 + 9),this,id_00,(local_c4 & 8) == 0);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
          }
          else {
            cVar6 = '\x01';
            if (9 < id_00) {
              cVar3 = '\x04';
              do {
                cVar6 = cVar3;
                uVar23 = (uint)uVar26;
                if (uVar23 < 100) {
                  cVar6 = cVar6 + -2;
                  goto LAB_001e9723;
                }
                if (uVar23 < 1000) {
                  cVar6 = cVar6 + -1;
                  goto LAB_001e9723;
                }
                if (uVar23 < 10000) goto LAB_001e9723;
                uVar26 = uVar26 / 10000;
                cVar3 = cVar6 + '\x04';
              } while (99999 < uVar23);
              cVar6 = cVar6 + '\x01';
            }
LAB_001e9723:
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            ::std::__cxx11::string::_M_construct((ulong)(local_f1 + 9),cVar6);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_e8._M_dataplus._M_p,(undefined4)local_e8._M_string_length,id_00);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar33 = (ulong)(pSVar12->parent_type).id;
          pSVar12 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                               ptr + uVar33);
        }
      }
      else {
        bVar5 = (this->options).flatten_multidimensional_arrays;
        if ((bool)bVar5 == true) {
          if ((pSVar12->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            local_90 = 0;
            local_b8 = 0;
          }
          else {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            bVar5 = (this->options).flatten_multidimensional_arrays;
            uVar24 = (undefined7)((ulong)pSVar18 >> 8);
            local_90 = (uint)CONCAT71(uVar24,1);
            pSVar18 = (SPIRType *)CONCAT71(uVar24,1);
            local_b8 = (uint)pSVar18;
            uVar7 = extraout_EDX;
          }
        }
        if (((bVar5 & 1) == 0) || ((local_90 & 1) == 0)) {
          uVar23 = local_70;
          if ((uVar25 & 1) != 0) {
            uVar23 = local_c4;
          }
          pbVar31 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)uVar23;
          ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
          access_chain_internal_append_index
                    (this,__return_storage_ptr__,uVar7,pSVar18,uVar23,(bool *)ts_3,id_00);
          (*(this->super_Compiler)._vptr_Compiler[0x2c])
                    (this,__return_storage_ptr__,pSVar12,(ulong)local_c0);
        }
        else {
          if ((uVar25 & 1) == 0) {
            to_enclosed_expression_abi_cxx11_
                      ((string *)(local_f1 + 9),this,id_00,(local_c4 & 8) == 0);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
          }
          else {
            cVar6 = '\x01';
            if (9 < id_00) {
              cVar3 = '\x04';
              do {
                cVar6 = cVar3;
                uVar23 = (uint)uVar26;
                if (uVar23 < 100) {
                  cVar6 = cVar6 + -2;
                  goto LAB_001e936d;
                }
                if (uVar23 < 1000) {
                  cVar6 = cVar6 + -1;
                  goto LAB_001e936d;
                }
                if (uVar23 < 10000) goto LAB_001e936d;
                uVar26 = uVar26 / 10000;
                cVar3 = cVar6 + '\x04';
              } while (99999 < uVar23);
              cVar6 = cVar6 + '\x01';
            }
LAB_001e936d:
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            ::std::__cxx11::string::_M_construct((ulong)(local_f1 + 9),cVar6);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_e8._M_dataplus._M_p,(undefined4)local_e8._M_string_length,id_00);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          sVar21 = (pSVar12->array).super_VectorView<unsigned_int>.buffer_size;
          uVar7 = (uint32_t)sVar21;
          if (uVar7 != 0) {
            do {
              uVar7 = uVar7 - 1;
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              pCVar28 = this;
              to_array_size_abi_cxx11_(&local_b0,this,pSVar12,uVar7);
              enclose_expression((string *)(local_f1 + 9),pCVar28,&local_b0);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
            } while (uVar7 != 0);
            sVar21 = (pSVar12->array).super_VectorView<unsigned_int>.buffer_size;
          }
          if (sVar21 == 0) {
            local_b8 = 0;
          }
          else {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            if ((local_b8 & 1) != 0) goto LAB_001e8b4e;
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
LAB_001e8b4e:
        if (*(int *)&(pSVar12->super_IVariant).field_0xc == 0x15) {
          uVar33 = (ulong)(pSVar12->parent_type).id;
          pSVar12 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                               ptr + uVar33);
        }
LAB_001e9664:
        local_f1[0] = '\x01';
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != local_40);
    if ((local_b8 & 1) != 0) {
      prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_f1 + 9),
                 "Flattening of multidimensional arrays were enabled, but the access chain was terminated in the middle of a multidimensional array. This is not supported."
                 ,"");
      ::std::runtime_error::runtime_error(prVar22,(string *)(local_f1 + 9));
      *(undefined ***)prVar22 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar22,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if (meta != (AccessChainMeta *)0x0) {
    meta->need_transpose = (bool)((byte)local_b4 & 1);
    meta->storage_is_packed = local_f2;
    meta->storage_is_invariant = (bool)((byte)local_84 & 1);
    meta->storage_physical_type = local_c0;
    meta->relaxed_precision = (bool)((byte)local_88 & 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::access_chain_internal(uint32_t base, const uint32_t *indices, uint32_t count,
                                           AccessChainFlags flags, AccessChainMeta *meta)
{
	string expr;

	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool msb_is_id = (flags & ACCESS_CHAIN_LITERAL_MSB_FORCE_ID) != 0;
	bool chain_only = (flags & ACCESS_CHAIN_CHAIN_ONLY_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;
	bool flatten_member_reference = (flags & ACCESS_CHAIN_FLATTEN_ALL_MEMBERS_BIT) != 0;

	if (!chain_only)
	{
		// We handle transpose explicitly, so don't resolve that here.
		auto *e = maybe_get<SPIRExpression>(base);
		bool old_transpose = e && e->need_transpose;
		if (e)
			e->need_transpose = false;
		expr = to_enclosed_expression(base, register_expression_read);
		if (e)
			e->need_transpose = old_transpose;
	}

	// Start traversing type hierarchy at the proper non-pointer types,
	// but keep type_id referencing the original pointer for use below.
	uint32_t type_id = expression_type_id(base);

	if (!backend.native_pointers)
	{
		if (ptr_chain)
			SPIRV_CROSS_THROW("Backend does not support native pointers and does not support OpPtrAccessChain.");

		// Wrapped buffer reference pointer types will need to poke into the internal "value" member before
		// continuing the access chain.
		if (should_dereference(base))
		{
			auto &type = get<SPIRType>(type_id);
			expr = dereference_expression(type, expr);
		}
	}

	const auto *type = &get_pointee_type(type_id);

	bool access_chain_is_arrayed = expr.find_first_of('[') != string::npos;
	bool row_major_matrix_needs_conversion = is_non_native_row_major_matrix(base);
	bool is_packed = has_extended_decoration(base, SPIRVCrossDecorationPhysicalTypePacked);
	uint32_t physical_type = get_extended_decoration(base, SPIRVCrossDecorationPhysicalTypeID);
	bool is_invariant = has_decoration(base, DecorationInvariant);
	bool relaxed_precision = has_decoration(base, DecorationRelaxedPrecision);
	bool pending_array_enclose = false;
	bool dimension_flatten = false;

	const auto append_index = [&](uint32_t index, bool is_literal, bool is_ptr_chain = false) {
		AccessChainFlags mod_flags = flags;
		if (!is_literal)
			mod_flags &= ~ACCESS_CHAIN_INDEX_IS_LITERAL_BIT;
		if (!is_ptr_chain)
			mod_flags &= ~ACCESS_CHAIN_PTR_CHAIN_BIT;
		access_chain_internal_append_index(expr, base, type, mod_flags, access_chain_is_arrayed, index);
		check_physical_type_cast(expr, type, physical_type);
	};

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		bool is_literal = index_is_literal;
		if (is_literal && msb_is_id && (index >> 31u) != 0u)
		{
			is_literal = false;
			index &= 0x7fffffffu;
		}

		// Pointer chains
		if (ptr_chain && i == 0)
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays)
			{
				dimension_flatten = type->array.size() >= 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(type->array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(*type, j - 1));
				}

				if (type->array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			else
			{
				append_index(index, is_literal, true);
			}

			if (type->basetype == SPIRType::ControlPointArray)
			{
				type_id = type->parent_type;
				type = &get<SPIRType>(type_id);
			}

			access_chain_is_arrayed = true;
		}
		// Arrays
		else if (!type->array.empty())
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays && !pending_array_enclose)
			{
				dimension_flatten = type->array.size() > 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			assert(type->parent_type);

			auto *var = maybe_get<SPIRVariable>(base);
			if (backend.force_gl_in_out_block && i == 0 && var && is_builtin_variable(*var) &&
			    !has_decoration(type->self, DecorationBlock))
			{
				// This deals with scenarios for tesc/geom where arrays of gl_Position[] are declared.
				// Normally, these variables live in blocks when compiled from GLSL,
				// but HLSL seems to just emit straight arrays here.
				// We must pretend this access goes through gl_in/gl_out arrays
				// to be able to access certain builtins as arrays.
				// Similar concerns apply for mesh shaders where we have to redirect to gl_MeshVerticesEXT or MeshPrimitivesEXT.
				auto builtin = ir.meta[base].decoration.builtin_type;
				bool mesh_shader = get_execution_model() == ExecutionModelMeshEXT;

				switch (builtin)
				{
				// case BuiltInCullDistance: // These are already arrays, need to figure out rules for these in tess/geom.
				// case BuiltInClipDistance:
				case BuiltInPosition:
				case BuiltInPointSize:
					if (mesh_shader)
						expr = join("gl_MeshVerticesEXT[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassInput)
						expr = join("gl_in[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassOutput)
						expr = join("gl_out[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				case BuiltInPrimitiveId:
				case BuiltInLayer:
				case BuiltInViewportIndex:
				case BuiltInCullPrimitiveEXT:
				case BuiltInPrimitiveShadingRateKHR:
					if (mesh_shader)
						expr = join("gl_MeshPrimitivesEXT[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				default:
					append_index(index, is_literal);
					break;
				}
			}
			else if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				auto &parent_type = get<SPIRType>(type->parent_type);

				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(parent_type.array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(parent_type, j - 1));
				}

				if (parent_type.array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			// Some builtins are arrays in SPIR-V but not in other languages, e.g. gl_SampleMask[] is an array in SPIR-V but not in Metal.
			// By throwing away the index, we imply the index was 0, which it must be for gl_SampleMask.
			else if (!builtin_translates_to_nonarray(BuiltIn(get_decoration(base, DecorationBuiltIn))))
			{
				append_index(index, is_literal);
			}

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);

			access_chain_is_arrayed = true;
		}
		// For structs, the index refers to a constant, which indexes into the members, possibly through a redirection mapping.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			if (!is_literal)
				index = evaluate_constant_u32(index);

			if (index < uint32_t(type->member_type_index_redirection.size()))
				index = type->member_type_index_redirection[index];

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			BuiltIn builtin;
			if (is_member_builtin(*type, index, &builtin) && access_chain_needs_stage_io_builtin_translation(base))
			{
				if (access_chain_is_arrayed)
				{
					expr += ".";
					expr += builtin_to_glsl(builtin, type->storage);
				}
				else
					expr = builtin_to_glsl(builtin, type->storage);
			}
			else
			{
				// If the member has a qualified name, use it as the entire chain
				string qual_mbr_name = get_member_qualified_name(type_id, index);
				if (!qual_mbr_name.empty())
					expr = qual_mbr_name;
				else if (flatten_member_reference)
					expr += join("_", to_member_name(*type, index));
				else
					expr += to_member_reference(base, *type, index, ptr_chain);
			}

			if (has_member_decoration(type->self, index, DecorationInvariant))
				is_invariant = true;
			if (has_member_decoration(type->self, index, DecorationRelaxedPrecision))
				relaxed_precision = true;

			is_packed = member_is_packed_physical_type(*type, index);
			if (member_is_remapped_physical_type(*type, index))
				physical_type = get_extended_member_decoration(type->self, index, SPIRVCrossDecorationPhysicalTypeID);
			else
				physical_type = 0;

			row_major_matrix_needs_conversion = member_is_non_native_row_major_matrix(*type, index);
			type = &get<SPIRType>(type->member_types[index]);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			// If we have a row-major matrix here, we need to defer any transpose in case this access chain
			// is used to store a column. We can resolve it right here and now if we access a scalar directly,
			// by flipping indexing order of the matrix.

			expr += "[";
			if (is_literal)
				expr += convert_to_string(index);
			else
				expr += to_unpacked_expression(index, register_expression_read);
			expr += "]";

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			string deferred_index;
			if (row_major_matrix_needs_conversion)
			{
				// Flip indexing order.
				auto column_index = expr.find_last_of('[');
				if (column_index != string::npos)
				{
					deferred_index = expr.substr(column_index);
					expr.resize(column_index);
				}
			}

			// Internally, access chain implementation can also be used on composites,
			// ignore scalar access workarounds in this case.
			StorageClass effective_storage = StorageClassGeneric;
			bool ignore_potential_sliced_writes = false;
			if ((flags & ACCESS_CHAIN_FORCE_COMPOSITE_BIT) == 0)
			{
				if (expression_type(base).pointer)
					effective_storage = get_expression_effective_storage_class(base);

				// Special consideration for control points.
				// Control points can only be written by InvocationID, so there is no need
				// to consider scalar access chains here.
				// Cleans up some cases where it's very painful to determine the accurate storage class
				// since blocks can be partially masked ...
				auto *var = maybe_get_backing_variable(base);
				if (var && var->storage == StorageClassOutput &&
				    get_execution_model() == ExecutionModelTessellationControl &&
				    !has_decoration(var->self, DecorationPatch))
				{
					ignore_potential_sliced_writes = true;
				}
			}
			else
				ignore_potential_sliced_writes = true;

			if (!row_major_matrix_needs_conversion && !ignore_potential_sliced_writes)
			{
				// On some backends, we might not be able to safely access individual scalars in a vector.
				// To work around this, we might have to cast the access chain reference to something which can,
				// like a pointer to scalar, which we can then index into.
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			if (is_literal)
			{
				bool out_of_bounds = (index >= type->vecsize);

				if (!is_packed && !row_major_matrix_needs_conversion)
				{
					expr += ".";
					expr += index_to_swizzle(out_of_bounds ? 0 : index);
				}
				else
				{
					// For packed vectors, we can only access them as an array, not by swizzle.
					expr += join("[", out_of_bounds ? 0 : index, "]");
				}
			}
			else if (ir.ids[index].get_type() == TypeConstant && !is_packed && !row_major_matrix_needs_conversion)
			{
				auto &c = get<SPIRConstant>(index);
				bool out_of_bounds = (c.scalar() >= type->vecsize);

				if (c.specialization)
				{
					// If the index is a spec constant, we cannot turn extract into a swizzle.
					expr += join("[", out_of_bounds ? "0" : to_expression(index), "]");
				}
				else
				{
					expr += ".";
					expr += index_to_swizzle(out_of_bounds ? 0 : c.scalar());
				}
			}
			else
			{
				expr += "[";
				expr += to_unpacked_expression(index, register_expression_read);
				expr += "]";
			}

			if (row_major_matrix_needs_conversion && !ignore_potential_sliced_writes)
			{
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			expr += deferred_index;
			row_major_matrix_needs_conversion = false;

			is_packed = false;
			physical_type = 0;
			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		else if (!backend.allow_truncated_access_chain)
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (pending_array_enclose)
	{
		SPIRV_CROSS_THROW("Flattening of multidimensional arrays were enabled, "
		                  "but the access chain was terminated in the middle of a multidimensional array. "
		                  "This is not supported.");
	}

	if (meta)
	{
		meta->need_transpose = row_major_matrix_needs_conversion;
		meta->storage_is_packed = is_packed;
		meta->storage_is_invariant = is_invariant;
		meta->storage_physical_type = physical_type;
		meta->relaxed_precision = relaxed_precision;
	}

	return expr;
}